

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

void Pdr_SetPrint(FILE *pFile,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  undefined1 uVar1;
  int iVar2;
  void *__ptr;
  int local_38;
  int Entry;
  int k;
  int i;
  char *pBuff;
  Vec_Int_t *vFlopCounts_local;
  int nRegs_local;
  Pdr_Set_t *p_local;
  FILE *pFile_local;
  
  __ptr = malloc((long)(nRegs + 1));
  for (Entry = 0; Entry < nRegs; Entry = Entry + 1) {
    *(undefined1 *)((long)__ptr + (long)Entry) = 0x2d;
  }
  *(undefined1 *)((long)__ptr + (long)Entry) = 0;
  for (Entry = 0; Entry < p->nLits; Entry = Entry + 1) {
    if (*(int *)(&p->field_0x14 + (long)Entry * 4) != -1) {
      iVar2 = Abc_LitIsCompl(*(int *)(&p->field_0x14 + (long)Entry * 4));
      uVar1 = 0x31;
      if (iVar2 != 0) {
        uVar1 = 0x30;
      }
      iVar2 = Abc_Lit2Var(*(int *)(&p->field_0x14 + (long)Entry * 4));
      *(undefined1 *)((long)__ptr + (long)iVar2) = uVar1;
    }
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    local_38 = 0;
    for (Entry = 0; iVar2 = Vec_IntSize(vFlopCounts), Entry < iVar2; Entry = Entry + 1) {
      iVar2 = Vec_IntEntry(vFlopCounts,Entry);
      if (iVar2 != 0) {
        *(undefined1 *)((long)__ptr + (long)local_38) = *(undefined1 *)((long)__ptr + (long)Entry);
        local_38 = local_38 + 1;
      }
    }
    *(undefined1 *)((long)__ptr + (long)local_38) = 0;
  }
  fprintf((FILE *)pFile,"%s",__ptr);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Pdr_SetPrint( FILE * pFile, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        k = 0;
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    fprintf( pFile, "%s", pBuff );
    ABC_FREE( pBuff );
}